

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  BVH *bvh;
  NodeRef root;
  float *pfVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  size_t k;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vbool<4> vVar11;
  uint uVar12;
  int iVar13;
  float *vertices;
  ulong uVar14;
  undefined4 uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  ulong uVar20;
  ulong uVar21;
  NodeRef *pNVar22;
  bool bVar23;
  vint4 ai_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar39;
  float fVar40;
  vint4 bi_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar41;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi_2;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar72;
  uint uVar73;
  uint uVar74;
  undefined1 auVar71 [64];
  undefined1 auVar75 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_19b8 [16];
  ulong local_19a0;
  Scene *local_1998;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  longlong local_1898;
  longlong lStack_1890;
  longlong local_1888;
  longlong lStack_1880;
  TravRayK<4,_false> tray;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar5 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar38 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar42 = vpcmpeqd_avx(auVar38,(undefined1  [16])valid_i->field_0);
    auVar24 = ZEXT816(0) << 0x40;
    auVar31 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar24,5);
    auVar26 = auVar42 & auVar31;
    if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0')
    {
      auVar31 = vandps_avx(auVar31,auVar42);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx(auVar75,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar64._8_4_ = 0x219392ef;
      auVar64._0_8_ = 0x219392ef219392ef;
      auVar64._12_4_ = 0x219392ef;
      auVar42 = vcmpps_avx(auVar42,auVar64,1);
      auVar26 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar64,auVar42);
      auVar42 = vandps_avx(auVar75,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar42 = vcmpps_avx(auVar42,auVar64,1);
      auVar30 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar64,auVar42);
      auVar42 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar75);
      auVar42 = vcmpps_avx(auVar42,auVar64,1);
      auVar42 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar64,auVar42);
      auVar50 = vrcpps_avx(auVar26);
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = &DAT_3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_fma(auVar26,auVar50,auVar65);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar50,auVar50)
      ;
      auVar26 = vrcpps_avx(auVar30);
      auVar30 = vfnmadd213ps_fma(auVar30,auVar26,auVar65);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar30,auVar26,auVar26)
      ;
      auVar26 = vrcpps_avx(auVar42);
      auVar42 = vfnmadd213ps_fma(auVar42,auVar26,auVar65);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar42,auVar26,auVar26)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar42 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar24,1);
      auVar26._8_4_ = 0x10;
      auVar26._0_8_ = 0x1000000010;
      auVar26._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar42,auVar26);
      auVar42 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar24,5);
      auVar30._8_4_ = 0x20;
      auVar30._0_8_ = 0x2000000020;
      auVar30._12_4_ = 0x20;
      auVar50._8_4_ = 0x30;
      auVar50._0_8_ = 0x3000000030;
      auVar50._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar50,auVar30,auVar42);
      auVar42 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar24,5);
      auVar51._8_4_ = 0x40;
      auVar51._0_8_ = 0x4000000040;
      auVar51._12_4_ = 0x40;
      auVar55._8_4_ = 0x50;
      auVar55._0_8_ = 0x5000000050;
      auVar55._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar55,auVar51,auVar42);
      auVar42 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar24);
      auVar26 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar24);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar68 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar42,auVar31);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar42,auVar26,auVar31);
      terminated.field_0.i[1] = auVar31._4_4_ ^ auVar38._4_4_;
      terminated.field_0.i[0] = auVar31._0_4_ ^ auVar38._0_4_;
      terminated.field_0.i[2] = auVar31._8_4_ ^ auVar38._8_4_;
      terminated.field_0.i[3] = auVar31._12_4_ ^ auVar38._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar18 = 3;
      }
      else {
        uVar18 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar22 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar19 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar38 = vpcmpeqd_avx(auVar31,auVar31);
      auVar71 = ZEXT1664(auVar38);
LAB_00538a66:
      paVar19 = paVar19 + -1;
      root.ptr = pNVar22[-1].ptr;
      pNVar22 = pNVar22 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00539324;
      aVar76 = *paVar19;
      auVar38 = vcmpps_avx((undefined1  [16])aVar76,(undefined1  [16])tray.tfar.field_0,1);
      uVar12 = vmovmskps_avx(auVar38);
      if (uVar12 == 0) {
        iVar13 = 2;
      }
      else {
        uVar21 = (ulong)(uVar12 & 0xff);
        uVar12 = POPCOUNT(uVar12 & 0xff);
        iVar13 = 0;
        if (uVar12 <= uVar18) {
          do {
            k = 0;
            for (uVar14 = uVar21; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar71 = ZEXT1664(auVar71._0_16_);
            bVar23 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar23) {
              terminated.field_0.i[k] = -1;
            }
            uVar21 = uVar21 - 1 & uVar21;
          } while (uVar21 != 0);
          auVar38 = vpcmpeqd_avx(auVar71._0_16_,auVar71._0_16_);
          auVar71 = ZEXT1664(auVar38);
          auVar38 = auVar38 & ~(undefined1  [16])terminated.field_0;
          iVar13 = 3;
          auVar68 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar38._8_4_ = 0xff800000;
            auVar38._0_8_ = 0xff800000ff800000;
            auVar38._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar38,
                               (undefined1  [16])terminated.field_0);
            iVar13 = 2;
          }
        }
        vVar11.field_0 = terminated.field_0;
        if (uVar18 < uVar12) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00539324;
              auVar38 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar76,6);
              if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                uVar21 = (ulong)((uint)root.ptr & 0xf);
                if (uVar21 == 8) goto LAB_005392e9;
                lVar17 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                uVar14 = 0;
                auVar38 = auVar71._0_16_ ^ (undefined1  [16])terminated.field_0;
                goto LAB_00538c96;
              }
              iVar13 = 2;
              break;
            }
            auVar78 = ZEXT1664(auVar68._0_16_);
            uVar21 = 0;
            uVar14 = 8;
            do {
              uVar20 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar21 * 8);
              if (uVar20 != 8) {
                uVar15 = *(undefined4 *)(root.ptr + 0x20 + uVar21 * 4);
                auVar27._4_4_ = uVar15;
                auVar27._0_4_ = uVar15;
                auVar27._8_4_ = uVar15;
                auVar27._12_4_ = uVar15;
                auVar8._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar8._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar8._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar8._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar26 = vfmsub213ps_fma(auVar27,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar8);
                uVar15 = *(undefined4 *)(root.ptr + 0x40 + uVar21 * 4);
                auVar52._4_4_ = uVar15;
                auVar52._0_4_ = uVar15;
                auVar52._8_4_ = uVar15;
                auVar52._12_4_ = uVar15;
                auVar9._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar9._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar9._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar9._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar24 = vfmsub213ps_fma(auVar52,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar9);
                uVar15 = *(undefined4 *)(root.ptr + 0x60 + uVar21 * 4);
                auVar58._4_4_ = uVar15;
                auVar58._0_4_ = uVar15;
                auVar58._8_4_ = uVar15;
                auVar58._12_4_ = uVar15;
                auVar10._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar10._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar10._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar10._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar30 = vfmsub213ps_fma(auVar58,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar10);
                uVar15 = *(undefined4 *)(root.ptr + 0x30 + uVar21 * 4);
                auVar61._4_4_ = uVar15;
                auVar61._0_4_ = uVar15;
                auVar61._8_4_ = uVar15;
                auVar61._12_4_ = uVar15;
                auVar50 = vfmsub213ps_fma(auVar61,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar8);
                uVar15 = *(undefined4 *)(root.ptr + 0x50 + uVar21 * 4);
                auVar47._4_4_ = uVar15;
                auVar47._0_4_ = uVar15;
                auVar47._8_4_ = uVar15;
                auVar47._12_4_ = uVar15;
                auVar51 = vfmsub213ps_fma(auVar47,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar9);
                uVar15 = *(undefined4 *)(root.ptr + 0x70 + uVar21 * 4);
                auVar33._4_4_ = uVar15;
                auVar33._0_4_ = uVar15;
                auVar33._8_4_ = uVar15;
                auVar33._12_4_ = uVar15;
                auVar55 = vfmsub213ps_fma(auVar33,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar10);
                auVar38 = vpminsd_avx(auVar26,auVar50);
                auVar42 = vpminsd_avx(auVar24,auVar51);
                auVar38 = vpmaxsd_avx(auVar38,auVar42);
                auVar42 = vpminsd_avx(auVar30,auVar55);
                auVar42 = vpmaxsd_avx(auVar38,auVar42);
                auVar38 = vpmaxsd_avx(auVar26,auVar50);
                auVar26 = vpmaxsd_avx(auVar24,auVar51);
                auVar26 = vpminsd_avx(auVar38,auVar26);
                auVar38 = vpmaxsd_avx(auVar30,auVar55);
                auVar26 = vpminsd_avx(auVar26,auVar38);
                auVar38 = vpmaxsd_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                auVar26 = vpminsd_avx(auVar26,(undefined1  [16])tray.tfar.field_0);
                auVar38 = vcmpps_avx(auVar38,auVar26,2);
                if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar38[0xf] < '\0') {
                  auVar38 = vblendvps_avx(auVar68._0_16_,auVar42,auVar38);
                  if (uVar14 != 8) {
                    pNVar22->ptr = uVar14;
                    pNVar22 = pNVar22 + 1;
                    *paVar19 = auVar78._0_16_;
                    paVar19 = paVar19 + 1;
                  }
                  auVar78 = ZEXT1664(auVar38);
                  uVar14 = uVar20;
                }
              }
              aVar76 = auVar78._0_16_;
            } while ((uVar20 != 8) && (bVar23 = uVar21 < 3, uVar21 = uVar21 + 1, bVar23));
            iVar13 = 0;
            if (uVar14 == 8) {
LAB_00538c3a:
              bVar23 = false;
              iVar13 = 4;
            }
            else {
              auVar38 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar76,6);
              uVar15 = vmovmskps_avx(auVar38);
              bVar23 = true;
              if ((uint)POPCOUNT(uVar15) <= uVar18) {
                pNVar22->ptr = uVar14;
                pNVar22 = pNVar22 + 1;
                *paVar19 = aVar76;
                paVar19 = paVar19 + 1;
                goto LAB_00538c3a;
              }
            }
            root.ptr = uVar14;
          } while (bVar23);
        }
      }
      goto LAB_00539327;
    }
  }
  return;
  while( true ) {
    uVar14 = local_19a0 + 1;
    lVar17 = lVar17 + 0x50;
    auVar38 = auVar26;
    if (uVar21 - 8 <= uVar14) break;
LAB_00538c96:
    v = (vuint<4> *)(uVar14 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_1998 = context->scene;
    uVar20 = 0;
    local_19a0 = uVar14;
    auVar42 = auVar38;
    while (*(int *)(lVar17 + uVar20 * 4) != -1) {
      pfVar2 = (local_1998->vertices).items[*(uint *)(lVar17 + -0x10 + uVar20 * 4)];
      uVar14 = (ulong)*(uint *)(lVar17 + -0x40 + uVar20 * 4);
      uVar16 = (ulong)*(uint *)(lVar17 + -0x30 + uVar20 * 4);
      fVar32 = pfVar2[uVar14];
      auVar48._4_4_ = fVar32;
      auVar48._0_4_ = fVar32;
      auVar48._8_4_ = fVar32;
      auVar48._12_4_ = fVar32;
      fVar39 = pfVar2[uVar14 + 1];
      auVar56._4_4_ = fVar39;
      auVar56._0_4_ = fVar39;
      auVar56._8_4_ = fVar39;
      auVar56._12_4_ = fVar39;
      fVar40 = pfVar2[uVar14 + 2];
      auVar59._4_4_ = fVar40;
      auVar59._0_4_ = fVar40;
      auVar59._8_4_ = fVar40;
      auVar59._12_4_ = fVar40;
      uVar14 = (ulong)*(uint *)(lVar17 + -0x20 + uVar20 * 4);
      fVar6 = fVar32 - pfVar2[uVar16];
      fVar41 = fVar39 - pfVar2[uVar16 + 1];
      fVar7 = fVar40 - pfVar2[uVar16 + 2];
      local_1888 = v[3].field_0.v[0];
      lStack_1880 = v[3].field_0.v[1];
      local_1898 = v[4].field_0.v[0];
      lStack_1890 = v[4].field_0.v[1];
      auVar43._4_4_ = fVar6;
      auVar43._0_4_ = fVar6;
      auVar43._8_4_ = fVar6;
      auVar43._12_4_ = fVar6;
      auVar53._4_4_ = fVar41;
      auVar53._0_4_ = fVar41;
      auVar53._8_4_ = fVar41;
      auVar53._12_4_ = fVar41;
      auVar28._4_4_ = fVar7;
      auVar28._0_4_ = fVar7;
      auVar28._8_4_ = fVar7;
      auVar28._12_4_ = fVar7;
      fVar32 = pfVar2[uVar14] - fVar32;
      auVar66._4_4_ = fVar32;
      auVar66._0_4_ = fVar32;
      auVar66._8_4_ = fVar32;
      auVar66._12_4_ = fVar32;
      fVar39 = pfVar2[uVar14 + 1] - fVar39;
      auVar69._4_4_ = fVar39;
      auVar69._0_4_ = fVar39;
      auVar69._8_4_ = fVar39;
      auVar69._12_4_ = fVar39;
      fVar40 = pfVar2[uVar14 + 2] - fVar40;
      auVar77._4_4_ = fVar40;
      auVar77._0_4_ = fVar40;
      auVar77._8_4_ = fVar40;
      auVar77._12_4_ = fVar40;
      fVar41 = fVar41 * fVar40;
      auVar24._4_4_ = fVar41;
      auVar24._0_4_ = fVar41;
      auVar24._8_4_ = fVar41;
      auVar24._12_4_ = fVar41;
      auVar28 = vfmsub231ps_fma(auVar24,auVar69,auVar28);
      fVar32 = fVar7 * fVar32;
      auVar29._4_4_ = fVar32;
      auVar29._0_4_ = fVar32;
      auVar29._8_4_ = fVar32;
      auVar29._12_4_ = fVar32;
      auVar29 = vfmsub231ps_fma(auVar29,auVar77,auVar43);
      fVar39 = fVar39 * fVar6;
      auVar34._4_4_ = fVar39;
      auVar34._0_4_ = fVar39;
      auVar34._8_4_ = fVar39;
      auVar34._12_4_ = fVar39;
      auVar50 = vsubps_avx(auVar48,*(undefined1 (*) [16])ray);
      auVar51 = vsubps_avx(auVar56,*(undefined1 (*) [16])(ray + 0x10));
      auVar34 = vfmsub231ps_fma(auVar34,auVar66,auVar53);
      auVar55 = vsubps_avx(auVar59,*(undefined1 (*) [16])(ray + 0x20));
      auVar26 = *(undefined1 (*) [16])(ray + 0x40);
      auVar24 = *(undefined1 (*) [16])(ray + 0x50);
      auVar30 = *(undefined1 (*) [16])(ray + 0x60);
      auVar79._0_4_ = auVar26._0_4_ * auVar51._0_4_;
      auVar79._4_4_ = auVar26._4_4_ * auVar51._4_4_;
      auVar79._8_4_ = auVar26._8_4_ * auVar51._8_4_;
      auVar79._12_4_ = auVar26._12_4_ * auVar51._12_4_;
      auVar48 = vfmsub231ps_fma(auVar79,auVar50,auVar24);
      auVar60._0_4_ = auVar30._0_4_ * auVar34._0_4_;
      auVar60._4_4_ = auVar30._4_4_ * auVar34._4_4_;
      auVar60._8_4_ = auVar30._8_4_ * auVar34._8_4_;
      auVar60._12_4_ = auVar30._12_4_ * auVar34._12_4_;
      auVar64 = vfmadd231ps_fma(auVar60,auVar29,auVar24);
      auVar80._0_4_ = auVar24._0_4_ * auVar55._0_4_;
      auVar80._4_4_ = auVar24._4_4_ * auVar55._4_4_;
      auVar80._8_4_ = auVar24._8_4_ * auVar55._8_4_;
      auVar80._12_4_ = auVar24._12_4_ * auVar55._12_4_;
      auVar56 = vfmsub231ps_fma(auVar80,auVar51,auVar30);
      auVar81._0_4_ = auVar30._0_4_ * auVar50._0_4_;
      auVar81._4_4_ = auVar30._4_4_ * auVar50._4_4_;
      auVar81._8_4_ = auVar30._8_4_ * auVar50._8_4_;
      auVar81._12_4_ = auVar30._12_4_ * auVar50._12_4_;
      auVar59 = vfmsub231ps_fma(auVar81,auVar55,auVar26);
      auVar65 = vfmadd231ps_fma(auVar64,auVar28,auVar26);
      auVar44._0_4_ = fVar40 * auVar48._0_4_;
      auVar44._4_4_ = fVar40 * auVar48._4_4_;
      auVar44._8_4_ = fVar40 * auVar48._8_4_;
      auVar44._12_4_ = fVar40 * auVar48._12_4_;
      auVar24 = vfmadd231ps_fma(auVar44,auVar59,auVar69);
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar26 = vandps_avx(auVar65,auVar70);
      auVar24 = vfmadd231ps_fma(auVar24,auVar56,auVar66);
      uVar12 = auVar26._0_4_;
      auVar67._0_4_ = uVar12 ^ auVar24._0_4_;
      uVar72 = auVar26._4_4_;
      auVar67._4_4_ = uVar72 ^ auVar24._4_4_;
      uVar73 = auVar26._8_4_;
      auVar67._8_4_ = uVar73 ^ auVar24._8_4_;
      uVar74 = auVar26._12_4_;
      auVar67._12_4_ = uVar74 ^ auVar24._12_4_;
      auVar30 = vcmpps_avx(auVar67,_DAT_01feba10,5);
      auVar64 = auVar42 & auVar30;
      auVar24 = auVar5;
      if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar64[0xf] < '\0'
         ) {
        auVar30 = vandps_avx(auVar30,auVar42);
        auVar46._0_4_ = auVar48._0_4_ * fVar7;
        auVar46._4_4_ = auVar48._4_4_ * fVar7;
        auVar46._8_4_ = auVar48._8_4_ * fVar7;
        auVar46._12_4_ = auVar48._12_4_ * fVar7;
        auVar64 = vfmadd132ps_fma(auVar59,auVar46,auVar53);
        auVar64 = vfmadd132ps_fma(auVar56,auVar64,auVar43);
        auVar54._0_4_ = uVar12 ^ auVar64._0_4_;
        auVar54._4_4_ = uVar72 ^ auVar64._4_4_;
        auVar54._8_4_ = uVar73 ^ auVar64._8_4_;
        auVar54._12_4_ = uVar74 ^ auVar64._12_4_;
        auVar64 = vcmpps_avx(auVar54,_DAT_01feba10,5);
        auVar48 = auVar30 & auVar64;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar48[0xf] < '\0') {
          auVar48 = vandps_avx(auVar65,auVar75);
          auVar30 = vandps_avx(auVar30,auVar64);
          auVar64 = vsubps_avx(auVar48,auVar67);
          auVar64 = vcmpps_avx(auVar64,auVar54,5);
          auVar56 = auVar30 & auVar64;
          if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar56[0xf] < '\0') {
            auVar30 = vandps_avx(auVar64,auVar30);
            auVar62._0_4_ = auVar55._0_4_ * auVar34._0_4_;
            auVar62._4_4_ = auVar55._4_4_ * auVar34._4_4_;
            auVar62._8_4_ = auVar55._8_4_ * auVar34._8_4_;
            auVar62._12_4_ = auVar55._12_4_ * auVar34._12_4_;
            auVar51 = vfmadd213ps_fma(auVar51,auVar29,auVar62);
            auVar50 = vfmadd213ps_fma(auVar50,auVar28,auVar51);
            auVar49._0_4_ = uVar12 ^ auVar50._0_4_;
            auVar49._4_4_ = uVar72 ^ auVar50._4_4_;
            auVar49._8_4_ = uVar73 ^ auVar50._8_4_;
            auVar49._12_4_ = uVar74 ^ auVar50._12_4_;
            auVar57._0_4_ = auVar48._0_4_ * *(float *)(ray + 0x30);
            auVar57._4_4_ = auVar48._4_4_ * *(float *)(ray + 0x34);
            auVar57._8_4_ = auVar48._8_4_ * *(float *)(ray + 0x38);
            auVar57._12_4_ = auVar48._12_4_ * *(float *)(ray + 0x3c);
            auVar63._0_4_ = auVar48._0_4_ * *(float *)(ray + 0x80);
            auVar63._4_4_ = auVar48._4_4_ * *(float *)(ray + 0x84);
            auVar63._8_4_ = auVar48._8_4_ * *(float *)(ray + 0x88);
            auVar63._12_4_ = auVar48._12_4_ * *(float *)(ray + 0x8c);
            auVar50 = vcmpps_avx(auVar57,auVar49,1);
            auVar51 = vcmpps_avx(auVar49,auVar63,2);
            auVar50 = vandps_avx(auVar51,auVar50);
            auVar51 = auVar30 & auVar50;
            if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar51[0xf] < '\0') {
              auVar30 = vandps_avx(auVar50,auVar30);
              auVar50 = vcmpps_avx(auVar65,_DAT_01feba10,4);
              auVar51 = auVar30 & auVar50;
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar51[0xf] < '\0') {
                auVar24 = vandps_avx(auVar50,auVar30);
                local_1958 = auVar34;
                local_1948 = auVar29;
                local_1938 = auVar28;
                local_1928 = auVar48;
                _local_1918 = auVar49;
                _local_1908 = auVar54;
                _local_18f8 = auVar67;
              }
            }
          }
        }
      }
      auVar68 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar30 = vpcmpeqd_avx(auVar26,auVar26);
      auVar71 = ZEXT1664(auVar30);
      uVar72 = *(uint *)((long)&local_1888 + uVar20 * 4);
      pGVar3 = (context->scene->geometries).items[uVar72].ptr;
      uVar12 = pGVar3->mask;
      auVar25._4_4_ = uVar12;
      auVar25._0_4_ = uVar12;
      auVar25._8_4_ = uVar12;
      auVar25._12_4_ = uVar12;
      auVar26 = vpand_avx(auVar25,*(undefined1 (*) [16])(ray + 0x90));
      auVar26 = vpcmpeqd_avx(auVar26,_DAT_01feba10);
      auVar50 = auVar24 & ~auVar26;
      if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar50[0xf] < '\0'
         ) {
        uVar15 = *(undefined4 *)((long)&local_1898 + uVar20 * 4);
        auVar26 = vandnps_avx(auVar26,auVar24);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar24 = vrcpps_avx(local_1928);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = &DAT_3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar50 = vfnmadd213ps_fma(auVar24,local_1928,auVar45);
          auVar24 = vfmadd132ps_fma(auVar50,auVar24,auVar24);
          fVar32 = auVar24._0_4_;
          local_1738._0_4_ = fVar32 * (float)local_18f8._0_4_;
          fVar39 = auVar24._4_4_;
          local_1738._4_4_ = fVar39 * (float)local_18f8._4_4_;
          fVar40 = auVar24._8_4_;
          local_1738._8_4_ = fVar40 * fStack_18f0;
          fVar41 = auVar24._12_4_;
          local_1738._12_4_ = fVar41 * fStack_18ec;
          local_1718._4_4_ = uVar15;
          local_1718._0_4_ = uVar15;
          local_1718._8_4_ = uVar15;
          local_1718._12_4_ = uVar15;
          local_1768 = local_1938._0_8_;
          uStack_1760 = local_1938._8_8_;
          local_1758 = local_1948._0_8_;
          uStack_1750 = local_1948._8_8_;
          local_1748 = local_1958;
          local_1728 = fVar32 * (float)local_1908._0_4_;
          fStack_1724 = fVar39 * (float)local_1908._4_4_;
          fStack_1720 = fVar40 * fStack_1900;
          fStack_171c = fVar41 * fStack_18fc;
          local_1708 = uVar72;
          uStack_1704 = uVar72;
          uStack_1700 = uVar72;
          uStack_16fc = uVar72;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          auVar35._0_4_ = fVar32 * (float)local_1918._0_4_;
          auVar35._4_4_ = fVar39 * (float)local_1918._4_4_;
          auVar35._8_4_ = fVar40 * fStack_1910;
          auVar35._12_4_ = fVar41 * fStack_190c;
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar24 = *(undefined1 (*) [16])(ray + 0x80);
          auVar50 = vblendvps_avx(auVar24,auVar35,auVar26);
          *(undefined1 (*) [16])(ray + 0x80) = auVar50;
          args.valid = (int *)local_19b8;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_19b8 = auVar26;
          args.ray = (RTCRayN *)ray;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar3->occlusionFilterN)(&args);
            auVar68 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_19b8 == (undefined1  [16])0x0) {
            auVar26 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar30 = vpcmpeqd_avx(auVar30,auVar30);
            auVar71 = ZEXT1664(auVar30);
            auVar30 = auVar30 ^ auVar26;
          }
          else {
            p_Var4 = context->args->filter;
            auVar26 = vpcmpeqd_avx(auVar30,auVar30);
            auVar71 = ZEXT1664(auVar26);
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var4)(&args);
              auVar26 = vpcmpeqd_avx(auVar26,auVar26);
              auVar71 = ZEXT1664(auVar26);
              auVar68 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar26 = vpcmpeqd_avx((undefined1  [16])0x0,local_19b8);
            auVar30 = auVar71._0_16_ ^ auVar26;
            auVar36._8_4_ = 0xff800000;
            auVar36._0_8_ = 0xff800000ff800000;
            auVar36._12_4_ = 0xff800000;
            auVar26 = vblendvps_avx(auVar36,*(undefined1 (*) [16])(args.ray + 0x80),auVar26);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar26;
          }
          auVar30 = vpslld_avx(auVar30,0x1f);
          auVar26 = vpsrad_avx(auVar30,0x1f);
          auVar24 = vblendvps_avx(auVar24,*(undefined1 (*) [16])pRVar1,auVar30);
          *(undefined1 (*) [16])pRVar1 = auVar24;
        }
        auVar42 = vpandn_avx(auVar26,auVar42);
      }
      if (((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
         || (bVar23 = 2 < uVar20, uVar20 = uVar20 + 1, bVar23)) break;
    }
    auVar26 = vpand_avx(auVar42,auVar38);
    auVar38 = auVar38 & auVar42;
    if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar38[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar71._0_16_ ^ auVar26);
LAB_005392e9:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar11.field_0,(undefined1  [16])terminated.field_0);
  auVar38 = auVar71._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar38[0xf]) {
LAB_00539324:
    iVar13 = 3;
  }
  else {
    auVar37._8_4_ = 0xff800000;
    auVar37._0_8_ = 0xff800000ff800000;
    auVar37._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar37,
                       (undefined1  [16])terminated.field_0);
    iVar13 = 0;
  }
LAB_00539327:
  if (iVar13 == 3) {
    auVar5 = vandps_avx(auVar31,(undefined1  [16])terminated.field_0);
    auVar31._8_4_ = 0xff800000;
    auVar31._0_8_ = 0xff800000ff800000;
    auVar31._12_4_ = 0xff800000;
    auVar5 = vmaskmovps_avx(auVar5,auVar31);
    *(undefined1 (*) [16])pRVar1 = auVar5;
    return;
  }
  goto LAB_00538a66;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }